

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

void Aig_ObjCollectMulti_rec(Aig_Obj_t *pRoot,Aig_Obj_t *pObj,Vec_Ptr_t *vSuper)

{
  int iVar1;
  Aig_Type_t AVar2;
  Aig_Type_t AVar3;
  Aig_Obj_t *pAVar4;
  Vec_Ptr_t *vSuper_local;
  Aig_Obj_t *pObj_local;
  Aig_Obj_t *pRoot_local;
  
  if (pRoot == pObj) {
LAB_0080d687:
    pAVar4 = Aig_ObjChild0(pObj);
    Aig_ObjCollectMulti_rec(pRoot,pAVar4,vSuper);
    pAVar4 = Aig_ObjChild1(pObj);
    Aig_ObjCollectMulti_rec(pRoot,pAVar4,vSuper);
  }
  else {
    iVar1 = Aig_IsComplement(pObj);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsCi(pObj);
      if (iVar1 == 0) {
        AVar2 = Aig_ObjType(pRoot);
        AVar3 = Aig_ObjType(pObj);
        if (AVar2 == AVar3) goto LAB_0080d687;
      }
    }
    Vec_PtrPushUnique(vSuper,pObj);
  }
  return;
}

Assistant:

void Aig_ObjCollectMulti_rec( Aig_Obj_t * pRoot, Aig_Obj_t * pObj, Vec_Ptr_t * vSuper )
{
    if ( pRoot != pObj && (Aig_IsComplement(pObj) || Aig_ObjIsCi(pObj) || Aig_ObjType(pRoot) != Aig_ObjType(pObj)) )
    {
        Vec_PtrPushUnique(vSuper, pObj);
        return;
    }
    Aig_ObjCollectMulti_rec( pRoot, Aig_ObjChild0(pObj), vSuper );
    Aig_ObjCollectMulti_rec( pRoot, Aig_ObjChild1(pObj), vSuper );
}